

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_mp_arithmetic(_func_mp_int_ptr_mp_int_ptr_mp_int_ptr *mp_arith)

{
  mp_int *x;
  mp_int *x_00;
  mp_int *pmVar1;
  mp_int *r;
  size_t i;
  mp_int *b;
  mp_int *a;
  _func_mp_int_ptr_mp_int_ptr_mp_int_ptr *mp_arith_local;
  
  x = mp_new(0x100);
  x_00 = mp_new(0x200);
  r = (mp_int *)0x0;
  while( true ) {
    pmVar1 = (mp_int *)(*looplimit)(0x10);
    if (pmVar1 <= r) break;
    mp_random_fill(x);
    mp_random_fill(x_00);
    log_start();
    pmVar1 = (*mp_arith)(x,x_00);
    log_end();
    mp_free(pmVar1);
    r = (mp_int *)((long)&r->nw + 1);
  }
  mp_free(x);
  mp_free(x_00);
  return;
}

Assistant:

static void test_mp_arithmetic(mp_int *(*mp_arith)(mp_int *x, mp_int *y))
{
    mp_int *a = mp_new(256), *b = mp_new(512);
    for (size_t i = 0; i < looplimit(16); i++) {
        mp_random_fill(a);
        mp_random_fill(b);
        log_start();
        mp_int *r = mp_arith(a, b);
        log_end();
        mp_free(r);
    }
    mp_free(a);
    mp_free(b);
}